

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerMSL::build_extended_vector_type
          (CompilerMSL *this,uint32_t type_id,uint32_t components,BaseType basetype)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  SPIRType *pSVar5;
  SPIRType *pSVar6;
  ParsedIR *this_00;
  ID *pIVar7;
  SPIRType *pSVar8;
  
  if (components < 2) {
    __assert_fail("components > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                  ,0x9d7,
                  "uint32_t spirv_cross::CompilerMSL::build_extended_vector_type(uint32_t, uint32_t, SPIRType::BaseType)"
                 );
  }
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  uVar2 = ParsedIR::increase_bound_by(this_00,1);
  pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type_id);
  bVar1 = Compiler::is_pointer((Compiler *)this,pSVar4);
  if (bVar1) {
    pSVar5 = Compiler::get_pointee_type((Compiler *)this,pSVar4);
    pSVar6 = pSVar4;
    pSVar4 = pSVar5;
  }
  else {
    pSVar6 = (SPIRType *)0x0;
  }
  bVar1 = Compiler::is_array((Compiler *)this,pSVar4);
  if (bVar1) {
    pSVar5 = Compiler::get_type((Compiler *)this,(TypeID)(pSVar4->parent_type).id);
    pSVar8 = pSVar4;
  }
  else {
    pSVar8 = (SPIRType *)0x0;
    pSVar5 = pSVar4;
  }
  pSVar4 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType_const&>
                     ((Compiler *)this,uVar2,pSVar5);
  bVar1 = Compiler::is_scalar((Compiler *)this,pSVar4);
  if (!bVar1) {
    bVar1 = Compiler::is_vector((Compiler *)this,pSVar4);
    if (!bVar1) {
      __assert_fail("is_scalar(*type) || is_vector(*type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                    ,0x9ea,
                    "uint32_t spirv_cross::CompilerMSL::build_extended_vector_type(uint32_t, uint32_t, SPIRType::BaseType)"
                   );
    }
  }
  *(undefined4 *)&(pSVar4->super_IVariant).field_0xc = 0x17;
  pSVar4->vecsize = components;
  if (basetype != Unknown) {
    pSVar4->basetype = basetype;
  }
  (pSVar4->super_IVariant).self.id = uVar2;
  bVar1 = Compiler::is_scalar((Compiler *)this,pSVar5);
  pIVar7 = &(pSVar5->super_IVariant).self;
  if (!bVar1) {
    pIVar7 = (ID *)&pSVar5->parent_type;
  }
  uVar3 = ((TypeID *)pIVar7)->id;
  (pSVar4->parent_type).id = uVar3;
  pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
  bVar1 = Compiler::is_scalar((Compiler *)this,pSVar5);
  if (bVar1) {
    (pSVar4->array).super_VectorView<unsigned_int>.buffer_size = 0;
    (pSVar4->array_size_literal).super_VectorView<bool>.buffer_size = 0;
    pSVar4->pointer = false;
    uVar3 = uVar2;
    if (pSVar8 != (SPIRType *)0x0) {
      uVar3 = ParsedIR::increase_bound_by(this_00,1);
      pSVar4 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                         ((Compiler *)this,uVar3,pSVar4);
      *(undefined4 *)&(pSVar4->super_IVariant).field_0xc = 0x1c;
      (pSVar4->parent_type).id = uVar2;
      SmallVector<unsigned_int,_8UL>::operator=(&pSVar4->array,&pSVar8->array);
      SmallVector<bool,_8UL>::operator=(&pSVar4->array_size_literal,&pSVar8->array_size_literal);
    }
    uVar2 = uVar3;
    if (pSVar6 != (SPIRType *)0x0) {
      uVar2 = ParsedIR::increase_bound_by(this_00,1);
      pSVar4 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                         ((Compiler *)this,uVar2,pSVar4);
      *(undefined4 *)&(pSVar4->super_IVariant).field_0xc = 0x20;
      (pSVar4->parent_type).id = uVar3;
      pSVar4->storage = pSVar6->storage;
      pSVar4->pointer = true;
      pSVar4->pointer_depth = pSVar4->pointer_depth + 1;
    }
    return uVar2;
  }
  __assert_fail("is_scalar(get<SPIRType>(type->parent_type))",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                ,0x9f2,
                "uint32_t spirv_cross::CompilerMSL::build_extended_vector_type(uint32_t, uint32_t, SPIRType::BaseType)"
               );
}

Assistant:

uint32_t CompilerMSL::build_extended_vector_type(uint32_t type_id, uint32_t components, SPIRType::BaseType basetype)
{
	assert(components > 1);
	uint32_t new_type_id = ir.increase_bound_by(1);
	const auto *p_old_type = &get<SPIRType>(type_id);
	const SPIRType *old_ptr_t = nullptr;
	const SPIRType *old_array_t = nullptr;

	if (is_pointer(*p_old_type))
	{
		old_ptr_t = p_old_type;
		p_old_type = &get_pointee_type(*old_ptr_t);
	}

	if (is_array(*p_old_type))
	{
		old_array_t = p_old_type;
		p_old_type = &get_type(old_array_t->parent_type);
	}

	auto *type = &set<SPIRType>(new_type_id, *p_old_type);
	assert(is_scalar(*type) || is_vector(*type));
	type->op = OpTypeVector;
	type->vecsize = components;
	if (basetype != SPIRType::Unknown)
		type->basetype = basetype;
	type->self = new_type_id;
	// We want parent type to point to the scalar type.
	type->parent_type = is_scalar(*p_old_type) ? TypeID(p_old_type->self) : p_old_type->parent_type;
	assert(is_scalar(get<SPIRType>(type->parent_type)));
	type->array.clear();
	type->array_size_literal.clear();
	type->pointer = false;

	if (old_array_t)
	{
		uint32_t array_type_id = ir.increase_bound_by(1);
		type = &set<SPIRType>(array_type_id, *type);
		type->op = OpTypeArray;
		type->parent_type = new_type_id;
		type->array = old_array_t->array;
		type->array_size_literal = old_array_t->array_size_literal;
		new_type_id = array_type_id;
	}

	if (old_ptr_t)
	{
		uint32_t ptr_type_id = ir.increase_bound_by(1);
		type = &set<SPIRType>(ptr_type_id, *type);
		type->op = OpTypePointer;
		type->parent_type = new_type_id;
		type->storage = old_ptr_t->storage;
		type->pointer = true;
		type->pointer_depth++;
		new_type_id = ptr_type_id;
	}

	return new_type_id;
}